

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Add<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *prototype)

{
  int iVar1;
  __int_type _Var2;
  int *piVar3;
  Arena *in_RDI;
  Type *result;
  FieldDescriptorProto *in_stack_ffffffffffffffe0;
  Type *local_8;
  
  if (((in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i == 0) ||
     (*(int *)(in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i <=
      *(int *)&(in_RDI->impl_).hint_._M_b._M_p)) {
    if (((in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i == 0) ||
       (*(int *)(in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i ==
        *(int *)((long)&(in_RDI->impl_).hint_._M_b._M_p + 4))) {
      Reserve((RepeatedPtrFieldBase *)in_stack_ffffffffffffffe0,(int)((ulong)in_RDI >> 0x20));
    }
    piVar3 = (int *)(in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i;
    *piVar3 = *piVar3 + 1;
    local_8 = GenericTypeHandler<google::protobuf::FieldDescriptorProto>::NewFromPrototype
                        (in_stack_ffffffffffffffe0,in_RDI);
    _Var2 = (in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i;
    iVar1 = *(int *)&(in_RDI->impl_).hint_._M_b._M_p;
    *(int *)&(in_RDI->impl_).hint_._M_b._M_p = iVar1 + 1;
    *(Type **)(_Var2 + 8 + (long)iVar1 * 8) = local_8;
  }
  else {
    _Var2 = (in_RDI->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i;
    iVar1 = *(int *)&(in_RDI->impl_).hint_._M_b._M_p;
    *(int *)&(in_RDI->impl_).hint_._M_b._M_p = iVar1 + 1;
    local_8 = cast<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                        (*(void **)(_Var2 + 8 + (long)iVar1 * 8));
  }
  return local_8;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::Add(
    typename TypeHandler::Type* prototype) {
  if (rep_ != NULL && current_size_ < rep_->allocated_size) {
    return cast<TypeHandler>(rep_->elements[current_size_++]);
  }
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  ++rep_->allocated_size;
  typename TypeHandler::Type* result =
      TypeHandler::NewFromPrototype(prototype, arena_);
  rep_->elements[current_size_++] = result;
  return result;
}